

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

int os_locate(char *fname,int flen,char *arg0,char *buf,size_t bufsiz)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  bool bVar4;
  size_t len;
  char *p;
  char *local_38;
  int local_4;
  
  iVar1 = access(in_RDI,0);
  if (iVar1 == 0) {
    memcpy(in_RCX,in_RDI,(long)in_ESI);
    in_RCX[in_ESI] = '\0';
    local_4 = 1;
  }
  else {
    if ((in_RDX != (char *)0x0) && (*in_RDX != '\0')) {
      sVar2 = strlen(in_RDX);
      local_38 = in_RDX + sVar2;
      while( true ) {
        bVar4 = false;
        if (in_RDX < local_38) {
          bVar4 = true;
          if ((local_38[-1] != '/') && (bVar4 = false, local_38[-1] != '\0')) {
            pcVar3 = strchr("",(int)local_38[-1]);
            bVar4 = pcVar3 != (char *)0x0;
          }
          bVar4 = (bool)(bVar4 ^ 1);
        }
        if (!bVar4) break;
        local_38 = local_38 + -1;
      }
      if (in_RDX < local_38) {
        sVar2 = (long)local_38 - (long)in_RDX;
        memcpy(in_RCX,in_RDX,sVar2);
        memcpy(in_RCX + sVar2,in_RDI,(long)in_ESI);
        in_RCX[sVar2 + (long)in_ESI] = '\0';
        iVar1 = access(in_RCX,0);
        if (iVar1 == 0) {
          return 1;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int os_locate(const char *fname, int flen, const char *arg0,
              char *buf, size_t bufsiz)
{
    /* Check the current directory */
    if (osfacc(fname) == 0)
    {
        memcpy(buf, fname, flen);
        buf[flen] = 0;
        return(1);
    }
    
    /* Check the program directory */
    if (arg0 && *arg0)
    {
        const char *p;
        
        /* find the end of the directory name of argv[0] */
        for (p = arg0 + strlen(arg0); p > arg0 && !ispathchar(*(p-1)); --p) ;
        
        /* don't bother if there's no directory on argv[0] */
        if (p > arg0)
        {
            size_t  len = (size_t)(p - arg0);
            
            memcpy(buf, arg0, len);
            memcpy(buf+len, fname, flen);
            buf[len+flen] = 0;
            if (osfacc(buf) == 0) return(1);
        }
    }
    
#ifdef USE_PATHSEARCH
    /* Check TADS path */
    if ( pathfind(fname, flen, "TADS", buf, bufsiz) )
        return(1);
#endif /* USE_PATHSEARCH */
    
    return(0);
}